

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  string *__lhs;
  char cVar1;
  char cVar2;
  cmCommand *pcVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  allocator local_61;
  string message;
  string sdestdir;
  
  __lhs = &(this->super_cmFileCopier).Destination;
  if (((this->super_cmFileCopier).Destination._M_string_length < 2) &&
     (bVar4 = std::operator!=(__lhs,"/"), bVar4)) {
    pcVar3 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
    std::__cxx11::string::string
              ((string *)&sdestdir,
               "called with inappropriate arguments. No DESTINATION provided or .",
               (allocator *)&message);
    cmCommand::SetError(pcVar3,&sdestdir);
    goto LAB_003ab264;
  }
  pcVar5 = cmsys::SystemTools::GetEnv("DESTDIR");
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string((string *)&sdestdir,pcVar5,(allocator *)&message);
    cmsys::SystemTools::ConvertToUnixSlashes(&sdestdir);
    pcVar5 = (this->super_cmFileCopier).Destination._M_dataplus._M_p;
    cVar1 = *pcVar5;
    bVar4 = true;
    if (2 < (this->super_cmFileCopier).Destination._M_string_length) {
      bVar4 = pcVar5[2] != '/';
    }
    cVar2 = pcVar5[1];
    if (cVar1 == '/') {
      if (cVar2 == '/') {
        std::__cxx11::string::string
                  ((string *)&message,
                   "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
                   ,&local_61);
        std::__cxx11::string::append((string *)&message);
        cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&message);
LAB_003ab25a:
        std::__cxx11::string::~string((string *)&message);
        goto LAB_003ab264;
      }
      lVar6 = 0;
    }
    else {
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        if ((bool)(cVar2 != ':' | bVar4)) {
LAB_003ab233:
          pcVar3 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
          std::__cxx11::string::string
                    ((string *)&message,
                     "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                     ,&local_61);
          cmCommand::SetError(pcVar3,&message);
          goto LAB_003ab25a;
        }
      }
      else if ((bool)(cVar2 != ':' | bVar4 | (byte)(cVar1 + 0xa5U) < 0xe6)) goto LAB_003ab233;
      lVar6 = 2;
    }
    std::operator+(&message,&sdestdir,pcVar5 + lVar6);
    std::__cxx11::string::operator=((string *)__lhs,(string *)&message);
    std::__cxx11::string::~string((string *)&message);
    this->DestDirLength = (int)sdestdir._M_string_length;
    std::__cxx11::string::~string((string *)&sdestdir);
  }
  if (*(int *)&(this->super_cmFileCopier).field_0xa4 == 6) {
    return true;
  }
  bVar4 = cmsys::SystemTools::FileExists((__lhs->_M_dataplus)._M_p);
  if ((bVar4) || (bVar4 = cmsys::SystemTools::MakeDirectory((__lhs->_M_dataplus)._M_p), bVar4)) {
    bVar4 = cmsys::SystemTools::FileIsDirectory(__lhs);
    if (bVar4) {
      return true;
    }
    std::operator+(&message,"INSTALL destination: ",__lhs);
    std::operator+(&sdestdir,&message," is not a directory.");
    std::__cxx11::string::~string((string *)&message);
    cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&sdestdir);
  }
  else {
    std::operator+(&message,"cannot create directory: ",__lhs);
    std::operator+(&sdestdir,&message,". Maybe need administrative privileges.");
    std::__cxx11::string::~string((string *)&message);
    cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&sdestdir);
  }
LAB_003ab264:
  std::__cxx11::string::~string((string *)&sdestdir);
  return false;
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if ( destination.size() < 2 && destination != "/" )
    {
    this->FileCommand->SetError("called with inappropriate arguments. "
        "No DESTINATION provided or .");
    return false;
    }

  const char* destdir = cmSystemTools::GetEnv("DESTDIR");
  if ( destdir && *destdir )
    {
    std::string sdestdir = destdir;
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if ( destination.size() > 2 )
      {
      ch3 = destination[2];
      }
    int skip = 0;
    if ( ch1 != '/' )
      {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
             ch2 == ':' )
        {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if ( ch3 != '/' )
          {
          relative = 1;
          }
        }
      else
        {
        relative = 1;
        }
      if ( relative )
        {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->FileCommand->SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
        }
      }
    else
      {
      if ( ch2 == '/' )
        {
        // looks like a network path.
        std::string message = "called with network path DESTINATION. This "
          "does not make sense when using DESTDIR. Specify local "
          "absolute path or remove DESTDIR environment variable."
          "\nDESTINATION=\n";
        message += destination;
        this->FileCommand->SetError(message);
        return false;
        }
      }
    destination = sdestdir + (destination.c_str() + skip);
    this->DestDirLength = int(sdestdir.size());
    }

  if(this->InstallType != cmInstallType_DIRECTORY)
    {
    if ( !cmSystemTools::FileExists(destination.c_str()) )
      {
      if ( !cmSystemTools::MakeDirectory(destination.c_str()) )
        {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->FileCommand->SetError(errstring);
        return false;
        }
      }
    if ( !cmSystemTools::FileIsDirectory(destination) )
      {
      std::string errstring = "INSTALL destination: " + destination +
        " is not a directory.";
      this->FileCommand->SetError(errstring);
      return false;
      }
    }
  return true;
}